

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseFulfill<(anonymous_namespace)::Foo>::
     call<(anonymous_namespace)::Foo,QtPromise::QPromiseResolve<(anonymous_namespace)::Foo>,QtPromise::QPromiseReject<(anonymous_namespace)::Foo>>
               (Foo *value,QPromiseResolve<(anonymous_namespace)::Foo> *resolve,
               QPromiseReject<(anonymous_namespace)::Foo> *param_3)

{
  QPromise<(anonymous_namespace)::Foo> *pQVar1;
  PromiseData<(anonymous_namespace)::Foo> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Data *pDVar3;
  Foo *__tmp;
  
  pQVar1 = ((resolve->m_resolver).m_d.d)->promise;
  if (pQVar1 != (QPromise<(anonymous_namespace)::Foo> *)0x0) {
    this = (pQVar1->super_QPromiseBase<(anonymous_namespace)::Foo>).m_d.d;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014fc00;
    *(int *)&p_Var2[1]._vptr__Sp_counted_base = value->m_foo;
    (this->m_value).m_data.
    super___shared_ptr<(anonymous_namespace)::Foo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    this_00 = (this->m_value).m_data.
              super___shared_ptr<(anonymous_namespace)::Foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (this->m_value).m_data.
    super___shared_ptr<(anonymous_namespace)::Foo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
    setSettled(&this->
                super_PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              );
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::dispatch
              (&((pQVar1->super_QPromiseBase<(anonymous_namespace)::Foo>).m_d.d)->
                super_PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              );
    pDVar3 = (resolve->m_resolver).m_d.d;
    if (pDVar3->promise != (QPromise<(anonymous_namespace)::Foo> *)0x0) {
      (*(pDVar3->promise->super_QPromiseBase<(anonymous_namespace)::Foo>)._vptr_QPromiseBase[1])();
      pDVar3 = (resolve->m_resolver).m_d.d;
    }
    pDVar3->promise = (QPromise<(anonymous_namespace)::Foo> *)0x0;
  }
  return;
}

Assistant:

Event(FType&& f) : QEvent{QEvent::None}, m_f{std::move(f)} { }